

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall
wasm::OptimizeInstructions::visitArrayNewFixed(OptimizeInstructions *this,ArrayNewFixed *curr)

{
  Type *this_00;
  Id IVar1;
  size_t sVar2;
  ulong uVar3;
  PassRunner *pPVar4;
  Module *module;
  bool bVar5;
  ulong uVar6;
  Expression *curr_00;
  Expression **ppEVar7;
  HeapType HVar8;
  Const *pCVar9;
  ArrayNew *pAVar10;
  Expression *pEVar11;
  Block *this_01;
  uint uVar12;
  optional<wasm::Type> type_;
  anon_union_16_6_1532cd5a_for_Literal_0 local_a0;
  Type local_88;
  Type type;
  ChildLocalizer localizer;
  Builder builder;
  
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression.type.id == 1) ||
     (sVar2 = (curr->values).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements, sVar2 == 0)) {
    return;
  }
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression.type;
  uVar12 = 1;
  while (uVar6 = (ulong)(uVar12 - 1), uVar6 < sVar2 - 1) {
    uVar3 = (curr->values).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if ((uVar3 <= uVar6) || (uVar3 <= uVar12)) goto LAB_009d3761;
    ppEVar7 = (curr->values).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
    bVar5 = areConsecutiveInputsEqual(this,ppEVar7[uVar6],ppEVar7[uVar12]);
    uVar12 = uVar12 + 1;
    if (!bVar5) {
      return;
    }
  }
  localizer._40_8_ =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  local_a0.i64 = (int64_t)wasm::Type::getHeapType(this_00);
  HeapType::getArray((HeapType *)&type);
  local_88.id = type.id;
  bVar5 = wasm::Type::isDefaultable(&local_88);
  if (bVar5) {
    if ((curr->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements == 0) goto LAB_009d3761;
    pPVar4 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).super_Pass.runner;
    module = (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule;
    pEVar11 = *(curr->values).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
    do {
      curr_00 = pEVar11;
      type.id = (uintptr_t)curr_00;
      ppEVar7 = Properties::getImmediateFallthroughPtr
                          ((Expression **)&type,&pPVar4->options,module,AllowTeeBrIf);
      pEVar11 = *ppEVar7;
    } while (*ppEVar7 != curr_00);
    IVar1 = curr_00->_id;
    pEVar11 = curr_00;
    while (IVar1 == RefAsId) {
      if (1 < *(int *)(pEVar11 + 1) - 1U) goto LAB_009d36a4;
      pEVar11 = (Expression *)pEVar11[1].type.id;
      IVar1 = pEVar11->_id;
    }
    if (((IVar1 - 0x29 < 0x2b) && ((0x40000000005U >> ((ulong)(IVar1 - 0x29) & 0x3f) & 1) != 0)) ||
       (IVar1 == ConstId)) {
      Properties::getLiteral((Literal *)&type,curr_00);
      Literal::makeZero((Literal *)&local_a0.func,local_88);
      bVar5 = Literal::operator==((Literal *)&type,(Literal *)&local_a0.func);
      Literal::~Literal((Literal *)&local_a0.func);
      Literal::~Literal((Literal *)&type);
      if (bVar5) {
        HVar8 = wasm::Type::getHeapType(this_00);
        pCVar9 = Builder::makeConst<int>((Builder *)&localizer.hasUnreachableChild,(int)sVar2);
        pAVar10 = Builder::makeArrayNew
                            ((Builder *)&localizer.hasUnreachableChild,HVar8,(Expression *)pCVar9,
                             (Expression *)0x0);
        pEVar11 = wasm::getDroppedChildrenAndAppend
                            ((Expression *)curr,
                             (this->
                             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                             ).
                             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .
                             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .currModule,
                             &((this->
                               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                               ).super_Pass.runner)->options,(Expression *)pAVar10,
                             NoticeParentEffects);
        replaceCurrent(this,pEVar11);
        return;
      }
    }
  }
LAB_009d36a4:
  if (sVar2 == 1) {
    return;
  }
  ChildLocalizer::ChildLocalizer
            ((ChildLocalizer *)&type,(Expression *)curr,
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currFunction,
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule,
             &((this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).super_Pass.runner)->options);
  this_01 = ChildLocalizer::getChildrenReplacement((ChildLocalizer *)&type);
  HVar8 = wasm::Type::getHeapType(this_00);
  pCVar9 = Builder::makeConst<int>((Builder *)&localizer.hasUnreachableChild,(int)sVar2);
  if ((curr->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements != 0) {
    pAVar10 = Builder::makeArrayNew
                        ((Builder *)&localizer.hasUnreachableChild,HVar8,(Expression *)pCVar9,
                         *(curr->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .data);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_01->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pAVar10);
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pAVar10;
    Block::finalize(this_01,type_,Unknown);
    replaceCurrent(this,(Expression *)this_01);
    if (localizer.wasm != (Module *)0x0) {
      operator_delete(localizer.wasm,
                      (long)localizer.sets.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)localizer.wasm);
      return;
    }
    return;
  }
LAB_009d3761:
  __assert_fail("index < usedElements",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                ,0xbc,
                "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
               );
}

Assistant:

void visitArrayNewFixed(ArrayNewFixed* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }

    auto size = curr->values.size();
    if (size == 0) {
      // TODO: Consider what to do in the trivial case of an empty array: we can
      //       can use ArrayNew or ArrayNewFixed there. Measure which is best.
      return;
    }

    // If all the values are equal then we can optimize, either to
    // array.new_default (if they are all equal to the default) or array.new (if
    // they are all equal to some other value). First, see if they are all
    // equal, which we do by comparing in pairs: [0,1], then [1,2], etc.
    for (Index i = 0; i < size - 1; i++) {
      if (!areConsecutiveInputsEqual(curr->values[i], curr->values[i + 1])) {
        return;
      }
    }

    // Great, they are all equal!

    Builder builder(*getModule());

    // See if they are equal to a constant, and if that constant is the default.
    auto type = curr->type.getHeapType().getArray().element.type;
    if (type.isDefaultable()) {
      auto* value = getFallthrough(curr->values[0]);

      if (Properties::isSingleConstantExpression(value) &&
          Properties::getLiteral(value) == Literal::makeZero(type)) {
        // They are all equal to the default. Drop the children and return an
        // array.new_with_default.
        auto* withDefault = builder.makeArrayNew(
          curr->type.getHeapType(), builder.makeConst(int32_t(size)));
        replaceCurrent(getDroppedChildrenAndAppend(curr, withDefault));
        return;
      }
    }

    // They are all equal to each other, but not to the default value. If there
    // are 2 or more elements here then we can save by using array.new. For
    // example, with 2 elements we are doing this:
    //
    //  (array.new_fixed
    //    (A)
    //    (A)
    //  )
    // =>
    //  (array.new
    //    (A)
    //    (i32.const 2) ;; get two copies of (A)
    //  )
    //
    // However, with 1, ArrayNewFixed is actually more compact, and we optimize
    // ArrayNew to it, above.
    if (size == 1) {
      return;
    }

    // Move children to locals, if we need to keep them around. We are removing
    // them all, except from the first, when we remove the array.new_fixed's
    // list of children and replace it with a single child + a constant for the
    // number of children.
    ChildLocalizer localizer(
      curr, getFunction(), *getModule(), getPassOptions());
    auto* block = localizer.getChildrenReplacement();
    auto* arrayNew = builder.makeArrayNew(curr->type.getHeapType(),
                                          builder.makeConst(int32_t(size)),
                                          curr->values[0]);
    block->list.push_back(arrayNew);
    block->finalize();
    replaceCurrent(block);
  }